

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

FieldDescriptorProto *
google::protobuf::descriptor_unittest::AddField
          (DescriptorProto *parent,string *name,int number,Label label,Type type)

{
  byte *pbVar1;
  bool bVar2;
  FieldDescriptorProto *pFVar3;
  Arena *arena;
  
  pFVar3 = (FieldDescriptorProto *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(parent->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 1;
  arena = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(pFVar3->field_0)._impl_.name_,name,arena);
  (pFVar3->field_0)._impl_.number_ = number;
  *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 0x40;
  bVar2 = protobuf::internal::ValidateEnum
                    (label,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
  if (bVar2) {
    (pFVar3->field_0)._impl_.label_ = label;
    pbVar1 = (byte *)((long)&pFVar3->field_0 + 1);
    *pbVar1 = *pbVar1 | 2;
    bVar2 = protobuf::internal::ValidateEnum
                      (type,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
    if (bVar2) {
      (pFVar3->field_0)._impl_.type_ = type;
      pbVar1 = (byte *)((long)&pFVar3->field_0 + 1);
      *pbVar1 = *pbVar1 | 4;
      return pFVar3;
    }
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a52,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x3a33,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

FieldDescriptorProto* AddField(DescriptorProto* parent, const std::string& name,
                               int number, FieldDescriptorProto::Label label,
                               FieldDescriptorProto::Type type) {
  FieldDescriptorProto* result = parent->add_field();
  result->set_name(name);
  result->set_number(number);
  result->set_label(label);
  result->set_type(type);
  return result;
}